

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ref.c
# Opt level: O3

void connect_and_write(uv_connect_t *req,int status)

{
  int iVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  int64_t eval_b;
  int64_t eval_a;
  uv_buf_t buf;
  undefined1 auStack_420 [16];
  undefined1 auStack_410 [16];
  undefined8 auStack_400 [23];
  long alStack_348 [41];
  code *pcStack_200;
  long lStack_1f0;
  long lStack_1e8;
  undefined1 auStack_1e0 [16];
  long alStack_1d0 [23];
  code *pcStack_118;
  long lStack_108;
  long lStack_100;
  undefined1 auStack_f8 [184];
  uv_connect_t *puStack_40;
  undefined8 local_30;
  long local_28;
  undefined1 local_20 [16];
  
  puStack_40 = (uv_connect_t *)0x1b978e;
  local_20 = uv_buf_init(buffer,0x7fff);
  if (req == &connect_req) {
    local_28 = (long)status;
    local_30 = 0;
    if (local_28 == 0) {
      puStack_40 = (uv_connect_t *)0x1b97e5;
      uv_write(&write_req,connect_req.handle,local_20,1,write_cb);
      connect_cb_called = connect_cb_called + 1;
      return;
    }
  }
  else {
    puStack_40 = (uv_connect_t *)0x1b97fa;
    connect_and_write_cold_1();
  }
  puStack_40 = (uv_connect_t *)run_test_udp_ref;
  connect_and_write_cold_2();
  pcStack_118 = (code *)0x1b9816;
  puStack_40 = req;
  uVar2 = uv_default_loop();
  pcStack_118 = (code *)0x1b9826;
  uv_udp_init(uVar2,auStack_f8);
  pcStack_118 = (code *)0x1b982e;
  uv_unref(auStack_f8);
  pcStack_118 = (code *)0x1b9833;
  uVar2 = uv_default_loop();
  pcStack_118 = (code *)0x1b983d;
  uv_run(uVar2,0);
  pcStack_118 = (code *)0x1b9845;
  do_close(auStack_f8);
  pcStack_118 = (code *)0x1b984a;
  uVar3 = uv_default_loop();
  pcStack_118 = (code *)0x1b985e;
  uv_walk(uVar3,close_walk_cb,0);
  pcStack_118 = (code *)0x1b9868;
  uv_run(uVar3,0);
  lStack_100 = 0;
  pcStack_118 = (code *)0x1b9876;
  uVar2 = uv_default_loop();
  pcStack_118 = (code *)0x1b987e;
  iVar1 = uv_loop_close(uVar2);
  lStack_108 = (long)iVar1;
  if (lStack_100 == lStack_108) {
    pcStack_118 = (code *)0x1b9896;
    uv_library_shutdown();
    return;
  }
  pcStack_118 = run_test_udp_ref2;
  run_test_udp_ref_cold_1();
  pcStack_200 = (code *)0x1b98ce;
  pcStack_118 = (code *)uVar3;
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,auStack_1e0);
  alStack_1d0[0] = (long)iVar1;
  lStack_1f0 = 0;
  if (alStack_1d0[0] == 0) {
    pcStack_200 = (code *)0x1b98f3;
    uVar2 = uv_default_loop();
    pcStack_200 = (code *)0x1b9903;
    uv_udp_init(uVar2,alStack_1d0);
    pcStack_200 = (code *)0x1b9912;
    uv_udp_bind(alStack_1d0,auStack_1e0,0);
    pcStack_200 = (code *)0x1b9924;
    uv_udp_recv_start(alStack_1d0,fail_cb);
    pcStack_200 = (code *)0x1b992c;
    uv_unref(alStack_1d0);
    pcStack_200 = (code *)0x1b9931;
    uVar2 = uv_default_loop();
    pcStack_200 = (code *)0x1b993b;
    uv_run(uVar2,0);
    pcStack_200 = (code *)0x1b9943;
    do_close(alStack_1d0);
    pcStack_200 = (code *)0x1b9948;
    uVar3 = uv_default_loop();
    pcStack_200 = (code *)0x1b995c;
    uv_walk(uVar3,close_walk_cb,0);
    pcStack_200 = (code *)0x1b9966;
    uv_run(uVar3,0);
    lStack_1f0 = 0;
    pcStack_200 = (code *)0x1b9974;
    uVar2 = uv_default_loop();
    pcStack_200 = (code *)0x1b997c;
    iVar1 = uv_loop_close(uVar2);
    lStack_1e8 = (long)iVar1;
    if (lStack_1f0 == lStack_1e8) {
      pcStack_200 = (code *)0x1b9994;
      uv_library_shutdown();
      return;
    }
  }
  else {
    pcStack_200 = (code *)0x1b99ae;
    run_test_udp_ref2_cold_1();
  }
  pcStack_200 = run_test_udp_ref3;
  run_test_udp_ref2_cold_2();
  pcStack_200 = (code *)uVar3;
  auStack_420 = uv_buf_init("PING",4);
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,auStack_410);
  alStack_348[0] = (long)iVar1;
  auStack_400[0] = 0;
  if (alStack_348[0] == 0) {
    uVar2 = uv_default_loop();
    uv_udp_init(uVar2,auStack_400);
    uv_udp_send(alStack_348,auStack_400,auStack_420,1,auStack_410,req_cb);
    uv_unref(auStack_400);
    uVar2 = uv_default_loop();
    uv_run(uVar2,0);
    if (req_cb_called == 1) {
      do_close(auStack_400);
      uVar2 = uv_default_loop();
      uv_walk(uVar2,close_walk_cb,0);
      uv_run(uVar2,0);
      uVar2 = uv_default_loop();
      iVar1 = uv_loop_close(uVar2);
      if (iVar1 == 0) {
        uv_library_shutdown();
        return;
      }
      goto LAB_001b9b10;
    }
  }
  else {
    run_test_udp_ref3_cold_1();
  }
  run_test_udp_ref3_cold_2();
LAB_001b9b10:
  run_test_udp_ref3_cold_3();
  req_cb_called = req_cb_called + 1;
  return;
}

Assistant:

static void connect_and_write(uv_connect_t* req, int status) {
  uv_buf_t buf = uv_buf_init(buffer, sizeof buffer);
  ASSERT_PTR_EQ(req, &connect_req);
  ASSERT_OK(status);
  uv_write(&write_req, req->handle, &buf, 1, write_cb);
  connect_cb_called++;
}